

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

SPOTTYPE * board_getSpotTypes(Board *board,uchar *spotTypesCountResult)

{
  Spot *pSVar1;
  SPOTTYPE *__ptr;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  bVar2 = board->spotsCount;
  if (bVar2 == 0) {
    bVar4 = 0;
    __ptr = (SPOTTYPE *)0x0;
  }
  else {
    uVar5 = 0;
    __ptr = (SPOTTYPE *)0x0;
    bVar4 = 0;
    do {
      pSVar1 = board->spots[uVar5];
      if (bVar4 != 0) {
        uVar3 = 0;
        do {
          if (__ptr[uVar3] == pSVar1->type) goto LAB_00105fec;
          uVar3 = uVar3 + 1;
        } while (bVar4 != uVar3);
      }
      bVar4 = bVar4 + 1;
      __ptr = (SPOTTYPE *)realloc(__ptr,(ulong)bVar4);
      __ptr[(ulong)bVar4 - 1] = pSVar1->type;
      bVar2 = board->spotsCount;
LAB_00105fec:
      uVar5 = uVar5 + 1;
    } while (uVar5 < bVar2);
  }
  *spotTypesCountResult = bVar4;
  return __ptr;
}

Assistant:

SPOTTYPE * board_getSpotTypes(Board * board, unsigned char * spotTypesCountResult)
{
	unsigned char i, j, spotTypesCount=0;
	bool hasType;
	SPOTTYPE * spotTypes = 0;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];
		hasType = false;
		for(j=0;j<spotTypesCount;j++)
		{
			if(spotTypes[j]==spot->type)
			{
				hasType = true;
				break;
			}
		}

		if(!hasType)
		{
			spotTypesCount++;
			// cppcheck-suppress memleakOnRealloc
			spotTypes = (SPOTTYPE *)realloc(spotTypes, sizeof(SPOTTYPE)*spotTypesCount);
			spotTypes[(spotTypesCount-1)] = spot->type;
		}
	}

	*spotTypesCountResult = spotTypesCount;

	return spotTypes;
}